

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::TriangleMesh,_embree::TriangleM<4>_>::
~BVHNBuilderTwoLevel(BVHNBuilderTwoLevel<8,_embree::TriangleMesh,_embree::TriangleM<4>_> *this)

{
  ~BVHNBuilderTwoLevel(this);
  operator_delete(this);
  return;
}

Assistant:

BVHNBuilderTwoLevel<N,Mesh,Primitive>::~BVHNBuilderTwoLevel () {
    }